

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bsplitcb(const_bstring str,uchar splitChar,int pos,_func_int_void_ptr_int_int *cb,void *parm)

{
  int iVar1;
  uchar *puVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  iVar6 = -1;
  iVar1 = -1;
  if (((-1 < pos) && (iVar1 = iVar6, str != (const_bstring)0x0)) &&
     (cb != (_func_int_void_ptr_int_int *)0x0)) {
    uVar3 = (ulong)(uint)pos;
    uVar4 = str->slen;
    if (pos <= (int)uVar4) {
      do {
        iVar1 = (int)uVar3;
        if (iVar1 < (int)uVar4) {
          puVar2 = str->data + uVar3;
          do {
            if (*puVar2 == splitChar) goto LAB_00136dc8;
            uVar5 = (int)uVar3 + 1;
            uVar3 = (ulong)uVar5;
            puVar2 = puVar2 + 1;
          } while ((int)uVar5 < (int)uVar4);
          uVar3 = (ulong)uVar4;
        }
LAB_00136dc8:
        iVar6 = (int)uVar3;
        iVar1 = (*cb)(parm,iVar1,iVar6 - iVar1);
        if (iVar1 < 0) {
          return iVar1;
        }
        uVar3 = (ulong)(iVar6 + 1);
        uVar4 = str->slen;
      } while (iVar6 < (int)uVar4);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int bsplitcb (const_bstring str, unsigned char splitChar, int pos,
	int (* cb) (void * parm, int ofs, int len), void * parm) {
int i, p, ret;

	if (cb == NULL || str == NULL || pos < 0 || pos > str->slen)
		return BSTR_ERR;

	p = pos;
	do {
		for (i=p; i < str->slen; i++) {
			if (str->data[i] == splitChar) break;
		}
		if ((ret = cb (parm, p, i - p)) < 0) return ret;
		p = i + 1;
	} while (p <= str->slen);
	return BSTR_OK;
}